

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void load_log(char *filename,int lines,cpu_log_t *buffer)

{
  long lVar1;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  int r;
  cpu_log_t log;
  int l;
  char buf [10];
  FILE *fp;
  int local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 auStack_74 [16];
  undefined4 local_34;
  int local_30;
  char local_2a [10];
  FILE *local_20;
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_20 = fopen(in_RDI,"rb");
  for (local_30 = 0; local_30 < local_c; local_30 = local_30 + 1) {
    fseek(local_20,2,1);
    fgets(local_2a,9,local_20);
    lVar1 = strtol(local_2a,(char **)0x0,0x10);
    local_80 = (undefined4)lVar1;
    fseek(local_20,3,1);
    fgets(local_2a,9,local_20);
    lVar1 = strtol(local_2a,(char **)0x0,0x10);
    local_7c = (undefined4)lVar1;
    fseek(local_20,3,1);
    fgets(local_2a,9,local_20);
    lVar1 = strtol(local_2a,(char **)0x0,0x10);
    local_78 = (undefined4)lVar1;
    for (local_84 = 0; local_84 < 0x10; local_84 = local_84 + 1) {
      fseek(local_20,3,1);
      fgets(local_2a,9,local_20);
      lVar1 = strtol(local_2a,(char **)0x0,0x10);
      auStack_74[local_84] = (int)lVar1;
    }
    fseek(local_20,1,1);
    fgets(local_2a,4,local_20);
    lVar1 = strtol(local_2a,(char **)0x0,10);
    local_34 = (undefined4)lVar1;
    fseek(local_20,1,1);
    memcpy((void *)(local_18 + (long)local_30 * 0x50),&local_80,0x50);
  }
  return;
}

Assistant:

void load_log(const char* filename, int lines, cpu_log_t* buffer) {
    FILE* fp = fopen(filename, "rb");
    char buf[10];
    for (int l = 0; l < lines; l++) {
        cpu_log_t log;
        fseek(fp, 2, SEEK_CUR); // Skip 0x
        fgets(buf, 9, fp);
        log.address = strtol(buf, NULL, 16);

        fseek(fp, 3, SEEK_CUR); // skip ,0x
        fgets(buf, 9, fp);
        log.instruction = strtol(buf, NULL, 16);

        fseek(fp, 3, SEEK_CUR); // skip ,0x
        fgets(buf, 9, fp);
        log.cpsr.raw = strtol(buf, NULL, 16);

        for (int r = 0; r < 16; r++) {
            fseek(fp, 3, SEEK_CUR); // skip ,0x
            fgets(buf, 9, fp);
            log.r[r] = strtol(buf, NULL, 16);
        }

        fseek(fp, 1, SEEK_CUR); // skip ,
        fgets(buf, 4, fp);
        log.cycles = strtol(buf, NULL, 10);

        fseek(fp, 1, SEEK_CUR); // Skip newline character

        buffer[l] = log;
    }
}